

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

HighsStatus __thiscall Highs::scaleColInterface(Highs *this,HighsInt col,double scale_value)

{
  pointer pHVar1;
  pointer pcVar2;
  HighsStatus HVar3;
  HighsBasisStatus HVar4;
  char cVar5;
  allocator local_a9;
  double local_a8;
  string local_a0;
  HighsLogOptions local_80;
  
  local_a8 = scale_value;
  HighsSparseMatrix::ensureColwise(&(this->model_).lp_.a_matrix_);
  if ((local_a8 == 0.0) && (!NAN(local_a8))) {
    return kError;
  }
  if (col < 0) {
    return kError;
  }
  if ((this->model_).lp_.num_col_ <= col) {
    return kError;
  }
  HighsLogOptions::HighsLogOptions(&local_80,&(this->options_).super_HighsOptionsStruct.log_options)
  ;
  HVar3 = applyScalingToLpCol(&(this->model_).lp_,col,local_a8);
  std::__cxx11::string::string((string *)&local_a0,"applyScalingToLpCol",&local_a9);
  HVar3 = interpretCallStatus(&local_80,HVar3,kOk,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::_Function_base::~_Function_base(&local_80.user_callback.super__Function_base);
  if (HVar3 == kError) {
    return kError;
  }
  if (0.0 <= local_a8) goto LAB_00251de1;
  if ((this->basis_).valid == true) {
    pHVar1 = (this->basis_).col_status.
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    HVar4 = pHVar1[(uint)col];
    if (HVar4 == kLower) {
      HVar4 = kUpper;
    }
    else {
      if (HVar4 != kUpper) goto LAB_00251da6;
      HVar4 = kLower;
    }
    pHVar1[(uint)col] = HVar4;
  }
LAB_00251da6:
  if (((local_a8 < 0.0) && ((this->ekk_instance_).status_.initialised_for_solve != false)) &&
     ((this->ekk_instance_).status_.has_basis == true)) {
    pcVar2 = (this->ekk_instance_).basis_.nonbasicMove_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    cVar5 = pcVar2[(uint)col];
    if (cVar5 == '\x01') {
      cVar5 = -1;
    }
    else {
      if (cVar5 != -1) goto LAB_00251de1;
      cVar5 = '\x01';
    }
    pcVar2[(uint)col] = cVar5;
  }
LAB_00251de1:
  invalidateModelStatusSolutionAndInfo(this);
  HEkk::updateStatus(&this->ekk_instance_,kScaledCol);
  return kOk;
}

Assistant:

HighsStatus Highs::scaleColInterface(const HighsInt col,
                                     const double scale_value) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsLp& lp = model_.lp_;
  HighsBasis& basis = basis_;
  HighsSimplexStatus& simplex_status = ekk_instance_.status_;

  // Ensure that the LP is column-wise
  lp.ensureColwise();
  if (col < 0) return HighsStatus::kError;
  if (col >= lp.num_col_) return HighsStatus::kError;
  if (!scale_value) return HighsStatus::kError;

  return_status = interpretCallStatus(options_.log_options,
                                      applyScalingToLpCol(lp, col, scale_value),
                                      return_status, "applyScalingToLpCol");
  if (return_status == HighsStatus::kError) return return_status;

  if (scale_value < 0 && basis.valid) {
    // Negative, so flip any nonbasic status
    if (basis.col_status[col] == HighsBasisStatus::kLower) {
      basis.col_status[col] = HighsBasisStatus::kUpper;
    } else if (basis.col_status[col] == HighsBasisStatus::kUpper) {
      basis.col_status[col] = HighsBasisStatus::kLower;
    }
  }
  if (simplex_status.initialised_for_solve) {
    SimplexBasis& simplex_basis = ekk_instance_.basis_;
    if (scale_value < 0 && simplex_status.has_basis) {
      // Negative, so flip any nonbasic status
      if (simplex_basis.nonbasicMove_[col] == kNonbasicMoveUp) {
        simplex_basis.nonbasicMove_[col] = kNonbasicMoveDn;
      } else if (simplex_basis.nonbasicMove_[col] == kNonbasicMoveDn) {
        simplex_basis.nonbasicMove_[col] = kNonbasicMoveUp;
      }
    }
  }
  // Deduce the consequences of a scaled column
  invalidateModelStatusSolutionAndInfo();

  // Determine any implications for simplex data
  ekk_instance_.updateStatus(LpAction::kScaledCol);
  return HighsStatus::kOk;
}